

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void cache_features(io_buf *cache,example *ae,uint64_t mask)

{
  byte *pbVar1;
  byte *pbVar2;
  
  cache_tag(cache,ae->tag);
  output_byte(cache,(char)*(undefined4 *)&(ae->super_example_predict).indices._end -
                    (char)*(undefined4 *)&(ae->super_example_predict).indices._begin);
  pbVar1 = (ae->super_example_predict).indices._end;
  for (pbVar2 = (ae->super_example_predict).indices._begin; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    output_features(cache,*pbVar2,(ae->super_example_predict).feature_space + *pbVar2,mask);
  }
  return;
}

Assistant:

void cache_features(io_buf& cache, example* ae, uint64_t mask)
{
  cache_tag(cache, ae->tag);
  output_byte(cache, (unsigned char)ae->indices.size());

  for (namespace_index ns : ae->indices) output_features(cache, ns, ae->feature_space[ns], mask);
}